

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool GetEQ(ConfigScanner *sc)

{
  if ((sc != (ConfigScanner *)0x0) && (*sc->ptr == '=')) {
    sc->ptr = sc->ptr + 1;
    return true;
  }
  return false;
}

Assistant:

bool GetEQ(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	bool result = *sc->ptr == '=';
	if (result)
	{
		sc->ptr++;
	}
	return result;
}